

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_in::iterate(TessellationShaderTCTEgl_in *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  float *value;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  float *value_00;
  ulong uVar7;
  float *value_01;
  long lVar8;
  float fVar9;
  float fVar10;
  long lStack_230;
  GLint expected_value_int [4];
  float local_208 [4];
  float *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long local_1e0;
  long local_1d8;
  string name;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  initTest(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar8 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x62a);
  (**(code **)(lVar8 + 0x1680))(this->m_po_id);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x630);
  (**(code **)(lVar8 + 0x5e0))(0x8c89);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glEnable(GL_RASTERIZER_DISCARD) call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x633);
  uVar7 = 0;
  (**(code **)(lVar8 + 0x30))(0);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback(GL_POINTS) call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x636);
  (**(code **)(lVar8 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glDrawArrays() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x63a);
  (**(code **)(lVar8 + 0x638))();
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x63d);
  value = (float *)(**(code **)(lVar8 + 0xd00))(0x8c8e,0,0x160,1);
  local_1f0 = lVar8;
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glMapBufferRange() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x648);
  do {
    lVar8 = local_1f0;
    if ((int)uVar7 == 2) {
      (**(code **)(local_1f0 + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x6e7);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    lVar8 = 0;
    local_1e8 = uVar7;
    while (lVar8 != 10) {
      local_208[0] = 0.0;
      local_208[1] = 0.0;
      local_208[2] = 0.0;
      local_208[3] = 0.0;
      expected_value_int[0] = 0;
      expected_value_int[1] = 0;
      expected_value_int[2] = 0;
      expected_value_int[3] = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,getXFBProperties::xfb_varyings[lVar8],(allocator<char> *)local_1b0)
      ;
      iVar3 = std::__cxx11::string::compare((char *)&name);
      local_1e0 = lVar8;
      if (iVar3 == 0) {
        local_208[0] = 22.0;
LAB_00d156b3:
        bVar2 = true;
LAB_00d156c2:
        lStack_230 = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&name);
        if (iVar3 == 0) {
          expected_value_int[0] = 0x17;
LAB_00d156bf:
          bVar2 = false;
          goto LAB_00d156c2;
        }
        iVar3 = std::__cxx11::string::compare((char *)&name);
        if (iVar3 == 0) {
          expected_value_int[0] = 0x18;
          expected_value_int[1] = 0x19;
          expected_value_int[2] = 0x1a;
          bVar2 = false;
          lStack_230 = 3;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&name);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&name);
            if (iVar3 == 0) {
              expected_value_int[0] = 0x26;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&name);
              if (iVar3 == 0) {
                local_208[0] = 39.0;
                goto LAB_00d156b3;
              }
              iVar3 = std::__cxx11::string::compare((char *)&name);
              if (iVar3 != 0) {
                iVar3 = std::__cxx11::string::compare((char *)&name);
                if (iVar3 == 0) {
                  expected_value_int[0] = 0x20;
                  expected_value_int[1] = 0x21;
                  bVar2 = false;
                  lStack_230 = 2;
                  goto LAB_00d156c4;
                }
                iVar3 = std::__cxx11::string::compare((char *)&name);
                if (iVar3 == 0) {
                  local_208[0] = 34.0;
                  local_208[1] = 35.0;
                  local_208[2] = 36.0;
                  local_208[3] = 37.0;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&name);
                  if (iVar3 != 0) {
                    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (pTVar6,"Unrecognized XFB name",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                               ,0x6ab);
                    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  local_208[0] = 5.0;
                  local_208[1] = 6.0;
                  local_208[2] = 7.0;
                  local_208[3] = 8.0;
                }
                goto LAB_00d1586a;
              }
              expected_value_int[0] = 0x1f;
            }
            goto LAB_00d156bf;
          }
          local_208[0] = 27.0;
          local_208[1] = 28.0;
          local_208[2] = 29.0;
          local_208[3] = 30.0;
LAB_00d1586a:
          bVar2 = true;
          lStack_230 = 4;
        }
      }
LAB_00d156c4:
      value_00 = local_208;
      local_1d8 = lStack_230;
      value_01 = (float *)expected_value_int;
      for (lVar8 = 0; lStack_230 != lVar8; lVar8 = lVar8 + 1) {
        if (bVar2) {
          fVar9 = *value - *value_00;
          fVar10 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar10 = fVar9;
          }
          if (1e-05 < fVar10) {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            local_1f8 = value;
            std::operator<<(&local_1a8,"Invalid component at index [");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::operator<<(&local_1a8,"] ");
            std::operator<<(&local_1a8,"(found:");
            pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1f8);
            std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " expected:");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value_00);
            poVar1 = &pMVar5->m_str;
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ") for varying [");
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            name._M_dataplus._M_p);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            lStack_230 = local_1d8;
            value = local_1f8;
          }
        }
        else if (*value != *value_01) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Invalid component at index [");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::operator<<(&local_1a8,"] ");
          std::operator<<(&local_1a8,"(found:");
          pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
          std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " expected:");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)value_01);
          poVar1 = &pMVar5->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ") for varying [");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          name._M_dataplus._M_p);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Invalid rendered value",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0x6d3);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        value = value + 1;
        value_01 = value_01 + 1;
        value_00 = value_00 + 1;
      }
      std::__cxx11::string::~string((string *)&name);
      lVar8 = local_1e0 + 1;
    }
    uVar7 = (ulong)((int)local_1e8 + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_in::iterate(void)
{
	/* Initialize ES test objects */
	initTest();

	/* Our program object takes a single vertex per patch */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Render the geometry. We're only interested in XFB data, not the visual outcome,
	 * so disable rasterization before we fire a draw call.
	 */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) call failed");
	{
		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Download the data we stored with TF */
	glw::GLint			n_xfb_names   = 0;
	void*				rendered_data = NULL;
	const glw::GLchar** xfb_names	 = NULL;
	glw::GLint			xfb_size	  = 0;

	getXFBProperties(&xfb_names, &n_xfb_names, &xfb_size);

	rendered_data = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, xfb_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	/* Move through the result buffer and make sure the values we retrieved are valid.
	 * Note that two points will be generated by the tessellator, so run the checks
	 * twice.
	 */
	typedef enum {
		XFB_VARYING_TYPE_FLOAT,
		XFB_VARYING_TYPE_INT,

		XFB_VARYING_TYPE_UNKNOWN
	} _xfb_varying_type;

	unsigned char* traveller_ptr = (unsigned char*)rendered_data;

	for (glw::GLint n_point = 0; n_point < 2 /* points */; ++n_point)
	{
		for (glw::GLint n_xfb_name = 0; n_xfb_name < n_xfb_names; ++n_xfb_name)
		{
			glw::GLfloat	  expected_value_float[4] = { 0.0f };
			glw::GLint		  expected_value_int[4]   = { 0 };
			std::string		  name					  = xfb_names[n_xfb_name];
			unsigned int	  n_varying_components	= 0;
			_xfb_varying_type varying_type			  = XFB_VARYING_TYPE_UNKNOWN;

			if (name.compare("result_float") == 0)
			{
				expected_value_float[0] = 22.0f;
				n_varying_components	= 1;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_int") == 0)
			{
				expected_value_int[0] = 23;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_ivec3") == 0)
			{
				expected_value_int[0] = 24;
				expected_value_int[1] = 25;
				expected_value_int[2] = 26;
				n_varying_components  = 3;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_mat2") == 0)
			{
				expected_value_float[0] = 27.0f;
				expected_value_float[1] = 28.0f;
				expected_value_float[2] = 29.0f;
				expected_value_float[3] = 30.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_struct_test1") == 0)
			{
				expected_value_int[0] = 38;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_struct_test2") == 0)
			{
				expected_value_float[0] = 39.0f;
				n_varying_components	= 1;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_uint") == 0)
			{
				expected_value_int[0] = 31;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_uvec2") == 0)
			{
				expected_value_int[0] = 32;
				expected_value_int[1] = 33;
				n_varying_components  = 2;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_vec4") == 0)
			{
				expected_value_float[0] = 34.0f;
				expected_value_float[1] = 35.0f;
				expected_value_float[2] = 36.0f;
				expected_value_float[3] = 37.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("gl_Position") == 0)
			{
				expected_value_float[0] = 5.0f;
				expected_value_float[1] = 6.0f;
				expected_value_float[2] = 7.0f;
				expected_value_float[3] = 8.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else
			{
				TCU_FAIL("Unrecognized XFB name");
			}

			/* Move through the requested amount of components and perform type-specific
			 * comparison.
			 */
			const float epsilon = (float)1e-5;

			for (unsigned int n_component = 0; n_component < n_varying_components; ++n_component)
			{
				switch (varying_type)
				{
				case XFB_VARYING_TYPE_FLOAT:
				{
					glw::GLfloat* rendered_value = (glw::GLfloat*)traveller_ptr;

					if (de::abs(*rendered_value - expected_value_float[n_component]) > epsilon)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid component at index [" << n_component << "] "
							<< "(found:" << *rendered_value << " expected:" << expected_value_float[n_component]
							<< ") for varying [" << name.c_str() << "]" << tcu::TestLog::EndMessage;
					}

					traveller_ptr += sizeof(glw::GLfloat);

					break;
				}

				case XFB_VARYING_TYPE_INT:
				{
					glw::GLint* rendered_value = (glw::GLint*)traveller_ptr;

					if (*rendered_value != expected_value_int[n_component])
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid component at index [" << n_component << "] "
							<< "(found:" << *rendered_value << " expected:" << expected_value_int[n_component]
							<< ") for varying [" << name.c_str() << "]" << tcu::TestLog::EndMessage;

						TCU_FAIL("Invalid rendered value");
					}

					traveller_ptr += sizeof(glw::GLint);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized varying type");
				}
				} /* switch(varying_type) */

			} /* for (all components) */
		}	 /* for (all XFBed variables) */
	}		  /* for (both points) */

	/* Unmap the BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}